

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

char * evutil_gai_strerror(int err)

{
  char *pcStack_10;
  int err_local;
  
  if (err == -0x15f91) {
    pcStack_10 = "Request canceled";
  }
  else if (err == -0xb) {
    pcStack_10 = "system error";
  }
  else if (err == -10) {
    pcStack_10 = "memory allocation failure";
  }
  else if (err == -9) {
    pcStack_10 = "address family for nodename not supported";
  }
  else if (err == -8) {
    pcStack_10 = "servname not supported for ai_socktype";
  }
  else if (err == -7) {
    pcStack_10 = "ai_socktype not supported";
  }
  else if (err == -6) {
    pcStack_10 = "ai_family not supported";
  }
  else if (err == -5) {
    pcStack_10 = "no address associated with nodename";
  }
  else if (err == -4) {
    pcStack_10 = "non-recoverable failure in name resolution";
  }
  else if (err == -3) {
    pcStack_10 = "temporary failure in name resolution";
  }
  else if (err == -2) {
    pcStack_10 = "nodename nor servname provided, or not known";
  }
  else if (err == -1) {
    pcStack_10 = "invalid value for ai_flags";
  }
  else if (err == 0) {
    pcStack_10 = "No error";
  }
  else {
    pcStack_10 = gai_strerror(err);
  }
  return pcStack_10;
}

Assistant:

const char *
evutil_gai_strerror(int err)
{
	/* As a sneaky side-benefit, this case statement will get most
	 * compilers to tell us if any of the error codes we defined
	 * conflict with the platform's native error codes. */
	switch (err) {
	case EVUTIL_EAI_CANCEL:
		return "Request canceled";
	case 0:
		return "No error";

	case EVUTIL_EAI_ADDRFAMILY:
		return "address family for nodename not supported";
	case EVUTIL_EAI_AGAIN:
		return "temporary failure in name resolution";
	case EVUTIL_EAI_BADFLAGS:
		return "invalid value for ai_flags";
	case EVUTIL_EAI_FAIL:
		return "non-recoverable failure in name resolution";
	case EVUTIL_EAI_FAMILY:
		return "ai_family not supported";
	case EVUTIL_EAI_MEMORY:
		return "memory allocation failure";
	case EVUTIL_EAI_NODATA:
		return "no address associated with nodename";
	case EVUTIL_EAI_NONAME:
		return "nodename nor servname provided, or not known";
	case EVUTIL_EAI_SERVICE:
		return "servname not supported for ai_socktype";
	case EVUTIL_EAI_SOCKTYPE:
		return "ai_socktype not supported";
	case EVUTIL_EAI_SYSTEM:
		return "system error";
	default:
#if defined(USE_NATIVE_GETADDRINFO) && defined(_WIN32)
		return gai_strerrorA(err);
#elif defined(USE_NATIVE_GETADDRINFO)
		return gai_strerror(err);
#else
		return "Unknown error code";
#endif
	}
}